

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcXsim.c
# Opt level: O0

void Abc_NtkCycleInitState(Abc_Ntk_t *pNtk,int nFrames,int fUseXval,int fVerbose)

{
  int iVar1;
  int Value1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_54;
  int local_30;
  int local_2c;
  int f;
  int i;
  Abc_Obj_t *pObj;
  int fVerbose_local;
  int fUseXval_local;
  int nFrames_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcXsim.c"
                  ,0xc4,"void Abc_NtkCycleInitState(Abc_Ntk_t *, int, int, int)");
  }
  Gia_ManRandom(1);
  pAVar2 = Abc_AigConst1(pNtk);
  Abc_ObjSetXsim(pAVar2,2);
  for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkBox(pNtk,local_2c);
    iVar1 = Abc_ObjIsLatch(pAVar2);
    if (iVar1 != 0) {
      pAVar3 = Abc_ObjFanout0(pAVar2);
      iVar1 = Abc_LatchInit(pAVar2);
      Abc_ObjSetXsim(pAVar3,iVar1);
    }
  }
  for (local_30 = 0; local_30 < nFrames; local_30 = local_30 + 1) {
    for (local_2c = 0; iVar1 = Abc_NtkPiNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar2 = Abc_NtkPi(pNtk,local_2c);
      if (fUseXval == 0) {
        local_54 = Abc_XsimRand2();
      }
      else {
        local_54 = 3;
      }
      Abc_ObjSetXsim(pAVar2,local_54);
    }
    for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_2c < iVar1; local_2c = local_2c + 1)
    {
      pAVar2 = Abc_NtkObj(pNtk,local_2c);
      if ((pAVar2 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar2), iVar1 != 0)) {
        iVar1 = Abc_ObjGetXsimFanin0(pAVar2);
        Value1 = Abc_ObjGetXsimFanin1(pAVar2);
        iVar1 = Abc_XsimAnd(iVar1,Value1);
        Abc_ObjSetXsim(pAVar2,iVar1);
      }
    }
    for (local_2c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar2 = Abc_NtkCo(pNtk,local_2c);
      iVar1 = Abc_ObjGetXsimFanin0(pAVar2);
      Abc_ObjSetXsim(pAVar2,iVar1);
    }
    for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_2c < iVar1; local_2c = local_2c + 1)
    {
      pAVar2 = Abc_NtkBox(pNtk,local_2c);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if (iVar1 != 0) {
        pAVar3 = Abc_ObjFanout0(pAVar2);
        pAVar2 = Abc_ObjFanin0(pAVar2);
        iVar1 = Abc_ObjGetXsim(pAVar2);
        Abc_ObjSetXsim(pAVar3,iVar1);
      }
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_NtkBox(pNtk,local_2c);
    iVar1 = Abc_ObjIsLatch(pAVar2);
    if (iVar1 != 0) {
      pAVar3 = Abc_ObjFanout0(pAVar2);
      iVar1 = Abc_ObjGetXsim(pAVar3);
      pAVar2->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)(long)iVar1;
    }
  }
  return;
}

Assistant:

void Abc_NtkCycleInitState( Abc_Ntk_t * pNtk, int nFrames, int fUseXval, int fVerbose )
{ 
    Abc_Obj_t * pObj;
    int i, f;
    assert( Abc_NtkIsStrash(pNtk) );
//    srand( 0x12341234 );
    Gia_ManRandom( 1 );
    // initialize the values
    Abc_ObjSetXsim( Abc_AigConst1(pNtk), XVS1 );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        Abc_ObjSetXsim( Abc_ObjFanout0(pObj), Abc_LatchInit(pObj) );
    // simulate for the given number of timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        Abc_NtkForEachPi( pNtk, pObj, i )
            Abc_ObjSetXsim( pObj, fUseXval? ABC_INIT_DC : Abc_XsimRand2() );
//            Abc_ObjSetXsim( pObj, ABC_INIT_ONE );
        Abc_AigForEachAnd( pNtk, pObj, i )
            Abc_ObjSetXsim( pObj, Abc_XsimAnd(Abc_ObjGetXsimFanin0(pObj), Abc_ObjGetXsimFanin1(pObj)) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            Abc_ObjSetXsim( pObj, Abc_ObjGetXsimFanin0(pObj) );
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_ObjSetXsim( Abc_ObjFanout0(pObj), Abc_ObjGetXsim(Abc_ObjFanin0(pObj)) );
    }
    // set the final values
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        pObj->pData = (void *)(ABC_PTRINT_T)Abc_ObjGetXsim(Abc_ObjFanout0(pObj));
//        printf( "%d", Abc_LatchIsInit1(pObj) );
    }
//    printf( "\n" );
}